

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_average.hpp
# Opt level: O3

void __thiscall
libtorrent::aux::sliding_average<int,_30>::add_sample(sliding_average<int,_30> *this,int s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = this->m_mean;
  uVar4 = this->m_num_samples;
  if ((int)uVar4 < 1) {
    iVar2 = 0;
  }
  else {
    iVar3 = iVar1 + s * -0x40;
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    if (0x1d < uVar4) {
      this->m_mean = (s * 0x40 - iVar1) / (int)uVar4 + iVar1;
      uVar4 = uVar4 - 1;
      goto LAB_0033bf17;
    }
  }
  this->m_num_samples = uVar4 + 1;
  this->m_mean = (s * 0x40 - iVar1) / (int)(uVar4 + 1) + iVar1;
  if ((int)uVar4 < 1) {
    return;
  }
LAB_0033bf17:
  this->m_average_deviation =
       (iVar2 - this->m_average_deviation) / (int)uVar4 + this->m_average_deviation;
  return;
}

Assistant:

void add_sample(Int s)
	{
		TORRENT_ASSERT(s < std::numeric_limits<Int>::max() / 64);
		// fixed point
		s *= 64;
		Int const deviation = (m_num_samples > 0) ? std::abs(m_mean - s) : 0;

		if (m_num_samples < inverted_gain)
			++m_num_samples;

		m_mean += (s - m_mean) / m_num_samples;

		if (m_num_samples > 1) {
			// the exact same thing for deviation off the mean except -1 on
			// the samples, because the number of deviation samples always lags
			// behind by 1 (you need to actual samples to have a single deviation
			// sample).
			m_average_deviation += (deviation - m_average_deviation) / (m_num_samples - 1);
		}
	}